

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,uint32_t label,
          uint32_t prediction,size_t num_features,bool progress_add,float progress_arg)

{
  long lVar1;
  ostream *poVar2;
  uint uVar3;
  string local_360;
  string local_340;
  ostringstream label_buf;
  undefined8 uStack_310;
  uint auStack_308 [88];
  ostringstream pred_buf;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&label_buf);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pred_buf);
  *(undefined8 *)((long)&uStack_310 + *(long *)(_label_buf + -0x18)) = 8;
  std::operator<<(&label_buf,0x20);
  lVar1 = *(long *)(_label_buf + -0x18);
  uVar3 = *(uint *)((long)auStack_308 + lVar1) & 0xffffff4f;
  if (label < 0x7fffffff) {
    *(uint *)((long)auStack_308 + lVar1) = uVar3 | 0x80;
    std::ostream::_M_insert<unsigned_long>((ulong)&label_buf);
  }
  else {
    *(uint *)((long)auStack_308 + lVar1) = uVar3 | 0x20;
    std::operator<<((ostream *)&label_buf," unknown");
  }
  *(undefined8 *)((long)&uStack_198 + *(long *)(_pred_buf + -0x18)) = 8;
  *(uint *)((long)auStack_190 + *(long *)(_pred_buf + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_pred_buf + -0x18)) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(&pred_buf,0x20);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  print_update(this,holdout_set_off,current_pass,&local_340,&local_360,num_features,progress_add,
               progress_arg);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pred_buf);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&label_buf);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, uint32_t label, uint32_t prediction, size_t num_features,
      bool progress_add, float progress_arg)
  {
    std::ostringstream label_buf, pred_buf;

    label_buf << std::setw(col_current_label) << std::setfill(' ');
    if (label < INT_MAX)
      label_buf << std::right << label;
    else
      label_buf << std::left << " unknown";

    pred_buf << std::setw(col_current_predict) << std::right << std::setfill(' ') << prediction;

    print_update(
        holdout_set_off, current_pass, label_buf.str(), pred_buf.str(), num_features, progress_add, progress_arg);
  }